

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt.cpp
# Opt level: O1

uint __thiscall crnlib::dxt3_block::get_alpha(dxt3_block *this,uint x,uint y,bool scaled)

{
  uint uVar1;
  undefined7 in_register_00000009;
  uint uVar2;
  
  uVar2 = this->m_alpha[(x >> 1) + y * 2] >> ((char)x * '\x04' & 4U) & 0xf;
  uVar1 = uVar2 << 4;
  if ((int)CONCAT71(in_register_00000009,scaled) == 0) {
    uVar1 = 0;
  }
  return uVar1 | uVar2;
}

Assistant:

uint dxt3_block::get_alpha(uint x, uint y, bool scaled) const
    {
        CRNLIB_ASSERT((x < cDXTBlockSize) && (y < cDXTBlockSize));

        uint value = m_alpha[(y << 1U) + (x >> 1U)];
        if (x & 1)
        {
            value >>= 4;
        }
        value &= 0xF;

        if (scaled)
        {
            value = (value << 4U) | value;
        }

        return value;
    }